

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O2

void remove_all_keys(int ssh_version)

{
  int iVar1;
  int index;
  PageantKey *pk;
  
  iVar1 = find_first_key_for_version(ssh_version);
  index = find_first_key_for_version(ssh_version + 1);
  while( true ) {
    if (index <= iVar1) {
      return;
    }
    index = index + -1;
    pk = (PageantKey *)delpos234(keytree,index);
    if ((pk->sort).ssh_version != ssh_version) break;
    pk_free(pk);
  }
  __assert_fail("pk->sort.ssh_version == ssh_version",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",0x114,
                "void remove_all_keys(int)");
}

Assistant:

static void remove_all_keys(int ssh_version)
{
    int start = find_first_key_for_version(ssh_version);
    int end = find_first_key_for_version(ssh_version + 1);
    while (end > start) {
        PageantKey *pk = delpos234(keytree, --end);
        assert(pk->sort.ssh_version == ssh_version);
        pk_free(pk);
    }
}